

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_engine.cpp
# Opt level: O1

void __thiscall
spoa::AlignmentEngine::AlignmentEngine
          (AlignmentEngine *this,AlignmentType type,AlignmentSubtype subtype,int8_t m,int8_t n,
          int8_t g,int8_t e,int8_t q,int8_t c)

{
  int8_t in_stack_00000008;
  
  this->_vptr_AlignmentEngine = (_func_int **)&PTR__AlignmentEngine_0011fcb0;
  this->type_ = type;
  this->subtype_ = subtype;
  this->m_ = m;
  this->n_ = n;
  this->g_ = g;
  this->e_ = in_stack_00000008;
  this->q_ = e;
  this->c_ = q;
  return;
}

Assistant:

AlignmentEngine::AlignmentEngine(
    AlignmentType type,
    AlignmentSubtype subtype,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c)
    : type_(type),
      subtype_(subtype),
      m_(m),
      n_(n),
      g_(g),
      e_(e),
      q_(q),
      c_(c) {
}